

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O2

HashTable<1UL> * CalculateInThreads<2ul>(HashTable<1UL> *__return_storage_ptr__,Data *input)

{
  int iVar1;
  ctrl_t *pcVar2;
  ctrl_t *pcVar3;
  slot_type *psVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  MappedReference<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>_> puVar8;
  uint i_1;
  uint local_144;
  iterator __begin0;
  thread threads [4];
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  local_108;
  ctrl_t *local_d8 [19];
  type invoke;
  
  lVar7 = 0;
  do {
    *(undefined1 **)((long)&local_108.ctrl_ + lVar7) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<Key<2ul>const,unsigned_int>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>>()
         ::empty_group;
    *(undefined8 *)((long)local_d8 + lVar7 + -8) = 0;
    *(undefined8 *)((long)local_d8 + lVar7 + -0x18) = 0;
    *(undefined8 *)((long)local_d8 + lVar7 + -0x28) = 0;
    *(undefined8 *)((long)local_d8 + lVar7 + -0x20) = 0;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0xc0);
  threads[2]._M_id._M_thread = (id)0;
  threads[3]._M_id._M_thread = (id)0;
  threads[0]._M_id._M_thread = (id)0;
  threads[1]._M_id._M_thread = (id)0;
  invoke.hash_tables = (HashTable<1UL> (*) [4])&local_108;
  invoke.input = input;
  for (local_144 = 0; local_144 < 4; local_144 = local_144 + 1) {
    std::thread::
    thread<CalculateInThreads<2ul>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(unsigned_int)_1_&,unsigned_int&,void>
              ((thread *)&__begin0,&invoke,&local_144);
    std::thread::operator=(threads + local_144,(thread *)&__begin0);
    std::thread::~thread((thread *)&__begin0);
  }
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
    std::thread::join();
  }
  for (lVar7 = 1; sVar6 = local_108.capacity_, sVar5 = local_108.size_, psVar4 = local_108.slots_,
      pcVar2 = local_108.ctrl_, lVar7 != 4; lVar7 = lVar7 + 1) {
    __begin0 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
               ::begin(&local_108 + lVar7);
    pcVar2 = (&local_108)[lVar7].ctrl_;
    pcVar3 = local_d8[lVar7 * 6 + -3];
    while (__begin0.ctrl_ != pcVar2 + (long)pcVar3) {
      iVar1 = *(int *)((long)__begin0.field_1.slot_ + 4);
      puVar8 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<2ul>,unsigned_int>,Key<2ul>::Hash,phmap::EqualTo<Key<2ul>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>
               ::operator[]<Key<2ul>,phmap::priv::FlatHashMapPolicy<Key<2ul>,unsigned_int>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<2ul>,unsigned_int>,Key<2ul>::Hash,phmap::EqualTo<Key<2ul>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>
                           *)&local_108,(key_arg<Key<2UL>_> *)__begin0.field_1.slot_);
      *puVar8 = *puVar8 + iVar1;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
      ::iterator::operator++(&__begin0);
    }
  }
  local_108.ctrl_ =
       phmap::priv::
       EmptyGroup<std::is_same<std::allocator<std::pair<Key<2ul>const,unsigned_int>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>>()
       ::empty_group;
  local_108.slots_ = (slot_type *)0x0;
  (__return_storage_ptr__->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .ctrl_ = pcVar2;
  (__return_storage_ptr__->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .slots_ = (slot_type *)psVar4;
  local_108.size_ = 0;
  local_108.capacity_ = 0;
  (__return_storage_ptr__->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .size_ = sVar5;
  (__return_storage_ptr__->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .capacity_ = sVar6;
  (__return_storage_ptr__->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       local_108.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  local_108.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
        )(_Head_base<0UL,_unsigned_long,_false>)0x0;
  lVar7 = 0x18;
  do {
    std::thread::~thread((thread *)((long)&threads[0]._M_id._M_thread + lVar7));
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  lVar7 = 0x90;
  do {
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
    ::~raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
                     *)((long)&local_108.ctrl_ + lVar7));
    lVar7 = lVar7 + -0x30;
  } while (lVar7 != -0x30);
  return __return_storage_ptr__;
}

Assistant:

HashTable<size> CalculateInThreads(const Cfg::Data& input)
{
    HashTable<size> hash_tables[thread_count];
    std::thread threads[thread_count];

    auto invoke = [&](unsigned begin) {
        Calculate<size>(input, begin, hash_tables[begin]);
    };

    for(unsigned i = 0; i < thread_count; ++i)
        threads[i] = std::thread(invoke, i);

    for(auto& i : threads)
        i.join();

    auto& frequencies = hash_tables[0];
    for(unsigned i = 1 ; i < thread_count; ++i)
        for(auto& j : hash_tables[i])
            frequencies[j.first] += j.second;

    // return the 'frequency' by move instead of copy.
    return std::move(frequencies);
}